

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (string *__return_storage_ptr__,detail *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v,string *delim)

{
  string *psVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  string *psVar3;
  bool bVar4;
  ostringstream s;
  ostringstream aoStack_1a8 [376];
  
  ::std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  psVar1 = *(string **)(this + 8);
  lVar2 = 0;
  for (psVar3 = *(string **)this; psVar3 != psVar1; psVar3 = psVar3 + 0x20) {
    bVar4 = lVar2 != 0;
    lVar2 = lVar2 + -1;
    if (bVar4) {
      ::std::operator<<((ostream *)aoStack_1a8,(string *)v);
    }
    ::std::operator<<((ostream *)aoStack_1a8,psVar3);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string join(const T &v, std::string delim = ",") {
    std::ostringstream s;
    size_t start = 0;
    for(const auto &i : v) {
        if(start++ > 0)
            s << delim;
        s << i;
    }
    return s.str();
}